

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

ExtPubkey * __thiscall
cfd::core::ExtPubkey::DerivePubkey
          (ExtPubkey *__return_storage_ptr__,ExtPubkey *this,string *string_path)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  allocator local_51;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,"ExtPubkey",&local_51);
  ToArrayFromString((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,string_path,
                    &local_38,this->depth_);
  ::std::__cxx11::string::~string((string *)&local_38);
  DerivePubkey(__return_storage_ptr__,this,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey ExtPubkey::DerivePubkey(const std::string& string_path) const {
  std::vector<uint32_t> path =
      ToArrayFromString(string_path, "ExtPubkey", depth_);
  return DerivePubkey(path);
}